

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_function_defaults.h
# Opt level: O1

size_t absl::lts_20240722::container_internal::
       TypeErasedApplyToSlotFn<absl::lts_20240722::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,google::protobuf::Descriptor_const*>
                 (void *fn,void *slot)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint64_t v;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)&hash_internal::MixingHashState::kSeed + *slot;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (SUB168(auVar1 * ZEXT816(0x9ddfea08eb382d69),0) ^
                 SUB168(auVar1 * ZEXT816(0x9ddfea08eb382d69),8)) + *slot;
  return SUB168(auVar2 * ZEXT816(0x9ddfea08eb382d69),0) ^
         SUB168(auVar2 * ZEXT816(0x9ddfea08eb382d69),8);
}

Assistant:

size_t operator()(const U& ptr) const {
      return absl::Hash<const T*>{}(HashEq::ToPtr(ptr));
    }